

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O2

bool qt_painterpath_check_crossing(QPainterPath *path,QRectF *rect)

{
  double dVar1;
  ElementType EVar2;
  QPainterPathPrivate *pQVar3;
  Element *pEVar4;
  qreal qVar5;
  qreal qVar6;
  qreal qVar7;
  qreal qVar8;
  bool bVar9;
  byte bVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long in_FS_OFFSET;
  double dVar15;
  qreal local_a8;
  qreal qStack_a0;
  QBezier local_98;
  QPointF local_58;
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.xp = 0.0;
  local_48.yp = 0.0;
  local_58.xp = 0.0;
  local_58.yp = 0.0;
  iVar13 = 0;
  iVar14 = 0;
  do {
    pQVar3 = (path->d_ptr).d.ptr;
    iVar12 = 0;
    if (pQVar3 != (QPainterPathPrivate *)0x0) {
      iVar12 = (int)(pQVar3->elements).d.size;
    }
    if (iVar12 <= iVar13) {
      bVar9 = operator!=(&local_48,&local_58);
      if (bVar9) {
        bVar9 = qt_painterpath_isect_line_rect(local_48.xp,local_48.yp,local_58.xp,local_58.yp,rect)
        ;
        bVar11 = true;
        if (bVar9) goto LAB_00396525;
      }
      bVar11 = false;
      goto LAB_00396525;
    }
    pEVar4 = (pQVar3->elements).d.ptr;
    local_a8 = pEVar4[iVar13].x;
    qStack_a0 = pEVar4[iVar13].y;
    EVar2 = pEVar4[iVar13].type;
    if (EVar2 == MoveToElement) {
      qVar5 = local_a8;
      qVar6 = qStack_a0;
      qVar7 = local_a8;
      qVar8 = qStack_a0;
      if ((((0 < iVar13) &&
           (bVar9 = qFuzzyCompare(local_48.xp,local_58.xp), qVar5 = local_a8, qVar6 = qStack_a0,
           qVar7 = local_a8, qVar8 = qStack_a0, bVar9)) &&
          (bVar9 = qFuzzyCompare(local_48.yp,local_58.yp), qVar5 = local_a8, qVar6 = qStack_a0,
          qVar7 = local_a8, qVar8 = qStack_a0, bVar9)) &&
         (bVar9 = qt_painterpath_isect_line_rect
                            (local_48.xp,local_48.yp,local_58.xp,local_58.yp,rect), qVar5 = local_a8
         , qVar6 = qStack_a0, qVar7 = local_a8, qVar8 = qStack_a0, bVar9)) goto LAB_003964e4;
    }
    else {
      if (EVar2 == LineToElement) {
        bVar9 = qt_painterpath_isect_line_rect(local_48.xp,local_48.yp,local_a8,qStack_a0,rect);
      }
      else {
        qVar5 = local_58.xp;
        qVar6 = local_58.yp;
        qVar7 = local_48.xp;
        qVar8 = local_48.yp;
        if (EVar2 != CurveToElement) goto LAB_00396415;
        qVar5 = pEVar4[iVar13 + 2].x;
        qVar6 = pEVar4[iVar13 + 2].y;
        local_98.x3 = pEVar4[(long)iVar13 + 1].x;
        local_98.y3 = pEVar4[(long)iVar13 + 1].y;
        local_98.x1 = local_48.xp;
        local_98.y1 = local_48.yp;
        local_98.x2 = local_a8;
        local_98.y2 = qStack_a0;
        local_98.x4 = qVar5;
        local_98.y4 = qVar6;
        bVar9 = qt_isect_curve_horizontal(&local_98,rect->yp,rect->xp,rect->w + rect->xp,0);
        if (((bVar9) ||
            (bVar9 = qt_isect_curve_horizontal
                               (&local_98,rect->yp + rect->h,rect->xp,rect->w + rect->xp,0), bVar9))
           || (bVar9 = qt_isect_curve_vertical(&local_98,rect->xp,rect->yp,rect->h + rect->yp,0),
              bVar9)) {
LAB_003964e4:
          bVar11 = true;
LAB_00396525:
          if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
            __stack_chk_fail();
          }
          return bVar11;
        }
        bVar9 = qt_isect_curve_vertical(&local_98,rect->xp + rect->w,rect->yp,rect->h + rect->yp,0);
        iVar13 = iVar13 + 2;
        local_a8 = qVar5;
        qStack_a0 = qVar6;
      }
      if (bVar9 != false) goto LAB_003964e4;
      local_48.xp = local_a8;
      local_48.yp = qStack_a0;
      qVar5 = local_58.xp;
      qVar6 = local_58.yp;
      qVar7 = local_48.xp;
      qVar8 = local_48.yp;
    }
LAB_00396415:
    local_48.yp = qVar8;
    local_48.xp = qVar7;
    local_58.yp = qVar6;
    local_58.xp = qVar5;
    dVar1 = rect->xp;
    if ((local_48.xp != dVar1) || (NAN(local_48.xp) || NAN(dVar1))) {
      dVar15 = rect->w + dVar1;
      if ((local_48.xp == dVar15) && (!NAN(local_48.xp) && !NAN(dVar15))) goto LAB_00396440;
      dVar15 = rect->yp;
LAB_00396461:
      if ((local_48.yp != dVar15) || (NAN(local_48.yp) || NAN(dVar15))) {
        if (dVar1 <= local_48.xp) {
          dVar15 = dVar15 + rect->h;
          if ((local_48.yp == dVar15) && (!NAN(local_48.yp) && !NAN(dVar15))) goto LAB_00396484;
        }
      }
      else if (dVar1 <= local_48.xp) {
LAB_00396484:
        if (local_48.xp <= dVar1 + rect->w) goto LAB_003964af;
      }
      bVar10 = QRectF::contains((QPointF *)rect);
      if (iVar14 == 0) {
        iVar14 = 2 - (uint)bVar10;
      }
      else if (iVar14 == 1) {
        iVar14 = 1;
        if (bVar10 == 0) goto LAB_003964e4;
      }
      else {
        iVar14 = 2;
        if (bVar10 != 0) goto LAB_003964e4;
      }
    }
    else {
LAB_00396440:
      dVar15 = rect->yp;
      if ((local_48.yp < dVar15) || (rect->h + dVar15 < local_48.yp)) goto LAB_00396461;
LAB_003964af:
      bVar9 = qFuzzyCompare(&local_48,&local_58);
      if (bVar9) {
        iVar14 = 0;
      }
    }
    iVar13 = iVar13 + 1;
  } while( true );
}

Assistant:

static bool qt_painterpath_check_crossing(const QPainterPath *path, const QRectF &rect)
{
    QPointF last_pt;
    QPointF last_start;
    enum { OnRect, InsideRect, OutsideRect} edgeStatus = OnRect;
    for (int i=0; i<path->elementCount(); ++i) {
        const QPainterPath::Element &e = path->elementAt(i);

        switch (e.type) {

        case QPainterPath::MoveToElement:
            if (i > 0
                && qFuzzyCompare(last_pt.x(), last_start.x())
                && qFuzzyCompare(last_pt.y(), last_start.y())
                && qt_painterpath_isect_line_rect(last_pt.x(), last_pt.y(),
                                                  last_start.x(), last_start.y(), rect))
                return true;
            last_start = last_pt = e;
            break;

        case QPainterPath::LineToElement:
            if (qt_painterpath_isect_line_rect(last_pt.x(), last_pt.y(), e.x, e.y, rect))
                return true;
            last_pt = e;
            break;

        case QPainterPath::CurveToElement:
            {
                QPointF cp2 = path->elementAt(++i);
                QPointF ep = path->elementAt(++i);
                QBezier bezier = QBezier::fromPoints(last_pt, e, cp2, ep);
                if (qt_isect_curve_horizontal(bezier, rect.top(), rect.left(), rect.right())
                    || qt_isect_curve_horizontal(bezier, rect.bottom(), rect.left(), rect.right())
                    || qt_isect_curve_vertical(bezier, rect.left(), rect.top(), rect.bottom())
                    || qt_isect_curve_vertical(bezier, rect.right(), rect.top(), rect.bottom()))
                    return true;
                last_pt = ep;
            }
            break;

        default:
            break;
        }
        // Handle crossing the edges of the rect at the end-points of individual sub-paths.
        // A point on on the edge itself is considered neither inside nor outside for this purpose.
        if (!pointOnEdge(rect, last_pt)) {
            bool contained = rect.contains(last_pt);
            switch (edgeStatus) {
            case OutsideRect:
                if (contained)
                    return true;
                break;
            case InsideRect:
                if (!contained)
                    return true;
                break;
            case OnRect:
                edgeStatus = contained ? InsideRect : OutsideRect;
                break;
            }
        } else {
            if (last_pt == last_start)
                edgeStatus = OnRect;
        }
    }

    // implicitly close last subpath
    if (last_pt != last_start
        && qt_painterpath_isect_line_rect(last_pt.x(), last_pt.y(),
                                          last_start.x(), last_start.y(), rect))
        return true;

    return false;
}